

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lyd_parser_find_operation(lyd_node *parent,uint32_t int_opts,lyd_node **op)

{
  ushort nodetype;
  lysc_node *plVar1;
  char *pcVar2;
  char *format;
  lys_module *plVar3;
  ly_ctx *plVar4;
  lyd_node_inner *plVar5;
  
  *op = (lyd_node *)0x0;
  plVar5 = (lyd_node_inner *)parent;
  if (parent != (lyd_node *)0x0) {
    do {
      plVar1 = (plVar5->field_0).node.schema;
      if ((plVar1 != (lysc_node *)0x0) && (nodetype = plVar1->nodetype, (nodetype & 0x700) != 0)) {
        if ((int_opts & 0x10) == 0) {
          if ((int_opts & 0xf) == 0) {
            if (parent->schema == (lysc_node *)0x0) {
              plVar3 = (lys_module *)&parent[2].schema;
            }
            else {
              plVar3 = parent->schema->module;
            }
            plVar4 = plVar3->ctx;
            pcVar2 = lys_nodetype2str(nodetype);
            ly_log(plVar4,LY_LLERR,LY_EINVAL,
                   "Invalid parent %s \"%s\" node when not parsing any operation.",pcVar2,
                   ((plVar5->field_0).node.schema)->name);
            return LY_EINVAL;
          }
          if (((int_opts & 5) == 0) && (nodetype == 0x100)) {
            if (parent->schema == (lysc_node *)0x0) {
              plVar3 = (lys_module *)&parent[2].schema;
            }
            else {
              plVar3 = parent->schema->module;
            }
            plVar4 = plVar3->ctx;
            pcVar2 = plVar1->name;
            format = "Invalid parent RPC \"%s\" node when not parsing RPC nor rpc-reply.";
          }
          else if (((int_opts & 6) == 0) && (nodetype == 0x200)) {
            if (parent->schema == (lysc_node *)0x0) {
              plVar3 = (lys_module *)&parent[2].schema;
            }
            else {
              plVar3 = parent->schema->module;
            }
            plVar4 = plVar3->ctx;
            pcVar2 = plVar1->name;
            format = "Invalid parent action \"%s\" node when not parsing action nor rpc-reply.";
          }
          else {
            if (((int_opts & 8) != 0) || (nodetype != 0x400)) goto LAB_00165aa1;
            if (parent->schema == (lysc_node *)0x0) {
              plVar3 = (lys_module *)&parent[2].schema;
            }
            else {
              plVar3 = parent->schema->module;
            }
            plVar4 = plVar3->ctx;
            pcVar2 = plVar1->name;
            format = "Invalid parent notification \"%s\" node when not parsing a notification.";
          }
          ly_log(plVar4,LY_LLERR,LY_EINVAL,format,pcVar2);
          return LY_EINVAL;
        }
LAB_00165aa1:
        *op = (lyd_node *)plVar5;
        return LY_SUCCESS;
      }
      plVar5 = (plVar5->field_0).node.parent;
    } while (plVar5 != (lyd_node_inner *)0x0);
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_parser_find_operation(const struct lyd_node *parent, uint32_t int_opts, struct lyd_node **op)
{
    const struct lyd_node *iter;

    *op = NULL;

    if (!parent) {
        /* no parent, nothing to look for */
        return LY_SUCCESS;
    }

    /* we need to find the operation node if it already exists */
    for (iter = parent; iter; iter = lyd_parent(iter)) {
        if (iter->schema && (iter->schema->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF))) {
            break;
        }
    }

    if (!iter) {
        /* no operation found */
        return LY_SUCCESS;
    }

    if (!(int_opts & LYD_INTOPT_ANY)) {
        if (!(int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_ACTION | LYD_INTOPT_NOTIF | LYD_INTOPT_REPLY))) {
            LOGERR(LYD_CTX(parent), LY_EINVAL, "Invalid parent %s \"%s\" node when not parsing any operation.",
                    lys_nodetype2str(iter->schema->nodetype), iter->schema->name);
            return LY_EINVAL;
        } else if ((iter->schema->nodetype == LYS_RPC) && !(int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_REPLY))) {
            LOGERR(LYD_CTX(parent), LY_EINVAL, "Invalid parent RPC \"%s\" node when not parsing RPC nor rpc-reply.",
                    iter->schema->name);
            return LY_EINVAL;
        } else if ((iter->schema->nodetype == LYS_ACTION) && !(int_opts & (LYD_INTOPT_ACTION | LYD_INTOPT_REPLY))) {
            LOGERR(LYD_CTX(parent), LY_EINVAL, "Invalid parent action \"%s\" node when not parsing action nor rpc-reply.",
                    iter->schema->name);
            return LY_EINVAL;
        } else if ((iter->schema->nodetype == LYS_NOTIF) && !(int_opts & LYD_INTOPT_NOTIF)) {
            LOGERR(LYD_CTX(parent), LY_EINVAL, "Invalid parent notification \"%s\" node when not parsing a notification.",
                    iter->schema->name);
            return LY_EINVAL;
        }
    }

    *op = (struct lyd_node *)iter;
    return LY_SUCCESS;
}